

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O1

void __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::replaceSigned<double,int>
          (LLVMNonTrappingFPToIntLoweringImpl *this,Unary *curr)

{
  Type type_;
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Index IVar4;
  UnaryOp UVar5;
  LocalSet *this_00;
  Unary *pUVar6;
  Const *pCVar7;
  Binary *this_01;
  Expression *pEVar8;
  If *this_02;
  ulong uVar9;
  Type in_R8;
  optional<wasm::Type> type__00;
  Builder local_50;
  Builder builder;
  
  uVar3 = curr->op - TruncSatSFloat32ToInt32;
  if ((uVar3 < 7) && ((0x55U >> (uVar3 & 0x1f) & 1) != 0)) {
    UVar5 = *(UnaryOp *)(&DAT_00e0fa10 + (ulong)uVar3 * 4);
    builder.wasm._4_4_ = *(BinaryOp *)(&DAT_00e0fa48 + (ulong)uVar3 * 4);
    local_50.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
         ).
         super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .
         super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .currModule;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (curr->value->type).id;
    IVar4 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                            ).
                            super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .
                            super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar2 << 0x40),in_R8);
    pEVar8 = curr->value;
    type_.id = (pEVar8->type).id;
    this_00 = (LocalSet *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
    this_00->index = IVar4;
    this_00->value = pEVar8;
    LocalSet::makeTee(this_00,type_);
    pUVar6 = (Unary *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x20,8);
    (pUVar6->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar6->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar6->op = UVar5;
    pUVar6->value = (Expression *)this_00;
    Unary::finalize(pUVar6);
    pCVar7 = Builder::makeConst<double>(&local_50,2147483647.0);
    this_01 = (Binary *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = builder.wasm._4_4_;
    this_01->left = (Expression *)pUVar6;
    this_01->right = (Expression *)pCVar7;
    Binary::finalize(this_01);
    UVar5 = getReplacementOp(this,curr->op);
    uVar1 = (curr->value->type).id;
    pEVar8 = (Expression *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x18,8);
    pEVar8->_id = LocalGetId;
    *(Index *)(pEVar8 + 1) = IVar4;
    (pEVar8->type).id = uVar1;
    pUVar6 = (Unary *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x20,8);
    (pUVar6->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar6->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar6->op = UVar5;
    pUVar6->value = pEVar8;
    Unary::finalize(pUVar6);
    pCVar7 = Builder::makeConst<int>(&local_50,-0x80000000);
    uVar9 = 0x28;
    this_02 = (If *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x28,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
    this_02->condition = (Expression *)this_01;
    this_02->ifTrue = (Expression *)pUVar6;
    this_02->ifFalse = (Expression *)pCVar7;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar9;
    If::finalize(this_02,type__00);
    Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                      ).
                      super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      .
                      super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                     ,(Expression *)this_02);
    return;
  }
  handle_unreachable("Unexpected opcode",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                     ,0x47);
}

Assistant:

void replaceSigned(Unary* curr) {
    BinaryOp ltOp;
    UnaryOp absOp;
    switch (curr->op) {
      case TruncSatSFloat32ToInt32:
      case TruncSatSFloat32ToInt64:
        ltOp = LtFloat32;
        absOp = AbsFloat32;
        break;
      case TruncSatSFloat64ToInt32:
      case TruncSatSFloat64ToInt64:
        ltOp = LtFloat64;
        absOp = AbsFloat64;
        break;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }

    Builder builder(*getModule());
    Index v = Builder::addVar(getFunction(), curr->value->type);
    // if fabs(operand) < INT_MAX then use the trapping operation, else return
    // INT_MIN. The altnernate value is correct for the case where the input is
    // INT_MIN itself; otherwise it's UB so any value will do.
    replaceCurrent(builder.makeIf(
      builder.makeBinary(
        ltOp,
        builder.makeUnary(
          absOp, builder.makeLocalTee(v, curr->value, curr->value->type)),
        builder.makeConst(static_cast<From>(std::numeric_limits<To>::max()))),
      builder.makeUnary(getReplacementOp(curr->op),
                        builder.makeLocalGet(v, curr->value->type)),
      builder.makeConst(std::numeric_limits<To>::min())));
  }